

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_CALLBACK::GarbageCollector
          (_Type_CALLBACK *this,Variable *object,offset_in_Memory_to_subr caller)

{
  void *pvVar1;
  char cVar2;
  Object *pOVar3;
  long in_RCX;
  long *plVar4;
  code *pcVar5;
  
  pOVar3 = Variable::operator->(object);
  plVar4 = (long *)((long)(pOVar3->memory->arr)._M_elems + in_RCX);
  pcVar5 = (code *)caller;
  if ((caller & 1) != 0) {
    pcVar5 = *(code **)(*plVar4 + -1 + caller);
  }
  pOVar3 = Variable::operator->(object);
  cVar2 = (*pcVar5)(plVar4,pOVar3->ID);
  if (cVar2 == '\0') {
    pOVar3 = Variable::operator->(object);
    pvVar1 = pOVar3->data;
    if (**(char **)((long)pvVar1 + 0x38) == '\0') {
      Variable::GarbageCollector((Variable *)((long)pvVar1 + 0x20),caller);
    }
    if (**(char **)((long)pvVar1 + 0x90) == '\0') {
      Namer::GarbageCollector((Namer *)((long)pvVar1 + 0x40),caller);
      return;
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Callback& c = object->GetData<Callback>();
    if (!c.This.isNull)
        c.This->GarbageCollector(caller);
    if (!c.nsp.isNull)
        c.nsp->GarbageCollector(caller);
}